

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VDotProdMulti_ManyVector(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  undefined8 uVar1;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_30;
  
  for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
    uVar1 = N_VDotProdLocal(in_RSI,*(undefined8 *)(in_RDX + local_30 * 8));
    *(undefined8 *)(in_RCX + local_30 * 8) = uVar1;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VDotProdMulti)(int nvec, N_Vector x, N_Vector* Y,
                                     sunrealtype* dotprods)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;

  /* call N_VDotProdLocal for each <x,Y[i]> pair */
  for (i = 0; i < nvec; i++)
  {
    dotprods[i] = N_VDotProdLocal(x, Y[i]);
    SUNCheckLastErr();
  }

#ifdef MANYVECTOR_BUILD_WITH_MPI
  /* accumulate totals and return */
  if (MANYVECTOR_COMM(x) != MPI_COMM_NULL)
  {
    SUNCheckMPICall(MPI_Allreduce(MPI_IN_PLACE, dotprods, nvec, MPI_SUNREALTYPE,
                                  MPI_SUM, MANYVECTOR_COMM(x)));
  }
#endif

  /* return with success */
  return SUN_SUCCESS;
}